

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O2

SUNErrCode
SUNAdaptController_EstimateStep
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  _func_SUNErrCode_SUNAdaptController_sunrealtype_int_sunrealtype_sunrealtype_ptr
  *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  if (C == (SUNAdaptController)0x0) {
    return -9999;
  }
  *hnew = h;
  UNRECOVERED_JUMPTABLE = C->ops->estimatestep;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_SUNErrCode_SUNAdaptController_sunrealtype_int_sunrealtype_sunrealtype_ptr *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(C,h,p,dsm,hnew);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep(SUNAdaptController C, sunrealtype h,
                                           int p, sunrealtype dsm,
                                           sunrealtype* hnew)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(isfinite(h), SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(p >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(dsm >= SUN_RCONST(0.0), SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(hnew, SUN_ERR_ARG_CORRUPT);
  *hnew = h; /* initialize output with identity */
  if (C->ops->estimatestep) { ier = C->ops->estimatestep(C, h, p, dsm, hnew); }
  return (ier);
}